

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipv6.c
# Opt level: O1

int lrtr_ipv6_addr_to_str(lrtr_ipv6_addr *ip_addr,char *b,uint len)

{
  uint uVar1;
  bool bVar2;
  byte bVar3;
  ulong uVar4;
  char *pcVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  ushort uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  uint16_t words [8];
  ushort auStack_48 [12];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar8 = -1;
  if (0x2d < len) {
    bVar3 = 0;
    uVar4 = 0;
    iVar8 = 0;
    uVar7 = 0;
    iVar6 = 0;
    uVar12 = 0;
    do {
      uVar9 = (ushort)(ip_addr->addr[uVar4 >> 1 & 0x7fffffff] >> (~bVar3 & 0x10));
      auStack_48[uVar4] = uVar9;
      if (uVar9 == 0) {
        if (iVar8 == 0) {
          uVar7 = uVar4 & 0xffffffff;
        }
        if (iVar6 <= iVar8) {
          uVar12 = uVar7;
        }
        iVar10 = iVar8 + 1;
        bVar2 = iVar6 <= iVar8;
        iVar8 = iVar10;
        if (bVar2) {
          iVar6 = iVar10;
        }
      }
      else {
        iVar8 = 0;
      }
      uVar4 = uVar4 + 1;
      bVar3 = bVar3 + 0x10;
    } while (uVar4 != 8);
    iVar8 = (int)uVar12;
    if (iVar6 < 2) {
      iVar8 = -1;
    }
    if ((iVar8 == 0) && ((iVar6 == 6 || ((iVar6 == 5 && (ip_addr->addr[2] == 0xffff)))))) {
      uVar1 = ip_addr->addr[3];
      pcVar5 = "ffff:";
      if (ip_addr->addr[2] == 0) {
        pcVar5 = "";
      }
      sprintf(b,"::%s%d.%d.%d.%d",pcVar5,(ulong)(uVar1 >> 0x18),(ulong)(uVar1 >> 0x10 & 0xff),
              (ulong)(uVar1 >> 8 & 0xff),uVar1 & 0xff);
    }
    else {
      iVar10 = 0;
      do {
        if (iVar10 == iVar8) {
          iVar11 = iVar10 + iVar6 + -1;
          *b = ':';
          if (iVar11 == 7) {
            b[1] = ':';
            b = b + 2;
            iVar11 = 7;
          }
          else {
            b = b + 1;
          }
        }
        else {
          if (iVar10 != 0) {
            *b = ':';
            b = b + 1;
          }
          iVar11 = sprintf(b,"%x",(ulong)auStack_48[iVar10]);
          b = b + iVar11;
          iVar11 = iVar10;
        }
        iVar10 = iVar11 + 1;
      } while (iVar11 < 7);
      *b = '\0';
    }
    iVar8 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return iVar8;
}

Assistant:

int lrtr_ipv6_addr_to_str(const struct lrtr_ipv6_addr *ip_addr, char *b, const unsigned int len)
{
	if (len < INET6_ADDRSTRLEN)
		return -1;
	const uint32_t *a = ip_addr->addr;
	uint16_t words[8];
	int bestpos = 0;
	int bestlen = 0;
	int curpos = 0;
	int curlen = 0;
	int i;

	/* First of all, preprocess the address and find the longest run of zeros */
	for (i = 0; i < 8; i++) {
		uint32_t x = a[i / 2];

		words[i] = ((i % 2) ? x : (x >> 16)) & 0xffff;
		if (words[i]) {
			curlen = 0;
		} else {
			if (!curlen)
				curpos = i;
			curlen++;
			if (curlen > bestlen) {
				bestpos = curpos;
				bestlen = curlen;
			}
		}
	}
	if (bestlen < 2)
		bestpos = -1;

	/* Is it an encapsulated IPv4 address? */
	if (!bestpos && ((bestlen == 5 && a[2] == 0xffff) || bestlen == 6))
	// if (!bestpos && ((bestlen == 5 && (a[2] == 0xffff)) || bestlen == 6))
	{
		uint32_t x = a[3];

		b += sprintf(b, "::%s%d.%d.%d.%d", a[2] ? "ffff:" : "", ((x >> 24) & 0xff), ((x >> 16) & 0xff),
			     ((x >> 8) & 0xff), (x & 0xff));
		return 0;
	}

	/* Normal IPv6 formatting, compress the largest sequence of zeros */
	for (i = 0; i < 8; i++) {
		if (i == bestpos) {
			i += bestlen - 1;
			*b++ = ':';
			if (i == 7)
				*b++ = ':';
		} else {
			if (i)
				*b++ = ':';
			b += sprintf(b, "%x", words[i]);
		}
	}
	*b = '\0';
	return 0;
}